

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableMessageGenerator IStack_68;
  
  lVar2 = 0;
  for (lVar3 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar3 < *(int *)(pDVar1 + 0x7c); lVar3 = lVar3 + 1) {
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&IStack_68,
               (FieldDescriptor *)(*(long *)(pDVar1 + 0x50) + lVar2),this->context_);
    ImmutableExtensionGenerator::GenerateRegistrationCode
              ((ImmutableExtensionGenerator *)&IStack_68,printer);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&IStack_68);
    lVar2 = lVar2 + 0x98;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(pDVar1 + 0x70); lVar3 = lVar3 + 1) {
    ImmutableMessageGenerator
              (&IStack_68,(Descriptor *)(*(long *)(pDVar1 + 0x38) + lVar2),this->context_);
    GenerateExtensionRegistrationCode(&IStack_68,printer);
    ~ImmutableMessageGenerator(&IStack_68);
    pDVar1 = (this->super_MessageGenerator).descriptor_;
    lVar2 = lVar2 + 0x90;
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateExtensionRegistrationCode(
    io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
        .GenerateExtensionRegistrationCode(printer);
  }
}